

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::DelayFilterOperation::DelayFilterOperation(DelayFilterOperation *this,Time delayTime)

{
  bool bVar1;
  baseType in_RSI;
  shared_ptr<helics::MessageTimeOperator> *in_RDI;
  shared_ptr<helics::MessageTimeOperator> *in_stack_ffffffffffffff98;
  TimeRepresentation<count_time<9,_long>_> __i;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffc8;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = in_RSI;
  FilterOperations::FilterOperations((FilterOperations *)in_RDI);
  (in_RDI->super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__DelayFilterOperation_00a4ad88;
  std::atomic<TimeRepresentation<count_time<9,_long>_>_>::atomic
            ((atomic<TimeRepresentation<count_time<9,_long>_>_> *)
             &(in_RDI->super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,local_8);
  __i.internalTimeCode = (baseType)(in_RDI + 1);
  std::shared_ptr<helics::MessageTimeOperator>::shared_ptr
            ((shared_ptr<helics::MessageTimeOperator> *)0x3a616b);
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    (&local_8,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar1) {
    std::atomic<TimeRepresentation<count_time<9,_long>_>_>::operator=
              ((atomic<TimeRepresentation<count_time<9,_long>_>_> *)in_RDI,__i);
  }
  std::
  make_shared<helics::MessageTimeOperator,helics::DelayFilterOperation::DelayFilterOperation(TimeRepresentation<count_time<9,long>>)::__0>
            (in_stack_ffffffffffffffc8);
  std::shared_ptr<helics::MessageTimeOperator>::operator=(in_RDI,in_stack_ffffffffffffff98);
  std::shared_ptr<helics::MessageTimeOperator>::~shared_ptr
            ((shared_ptr<helics::MessageTimeOperator> *)0x3a61de);
  return;
}

Assistant:

DelayFilterOperation::DelayFilterOperation(Time delayTime): delay(delayTime)
{
    if (delayTime < timeZero) {
        delay = timeZero;
    }
    td = std::make_shared<MessageTimeOperator>(
        [this](Time messageTime) { return messageTime + delay; });
}